

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void gradtrans(double *raw,int p,int q,int P,int Q,int M,double *A)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  double *pdVar11;
  double local_9d8;
  double w2 [100];
  double w3 [100];
  double w1 [100];
  
  iVar2 = q + p;
  iVar3 = iVar2 + P;
  uVar8 = M + Q + iVar3;
  uVar5 = 0;
  uVar7 = 0;
  if (0 < (int)uVar8) {
    uVar7 = (ulong)uVar8;
  }
  for (; uVar5 != uVar7; uVar5 = uVar5 + 1) {
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      if (uVar5 == uVar9) {
        A[uVar5 * ((long)(int)uVar8 + 1)] = (double)(int)uVar5;
      }
    }
  }
  if (0 < p) {
    uVar5 = (ulong)(uint)p;
    memcpy(w3 + 99,raw,uVar5 * 8);
    artrans(p,w3 + 99,&local_9d8);
    pdVar11 = A;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(p,w3 + 99,w2 + 99);
      pdVar6 = pdVar11;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        *pdVar6 = (w2[uVar9 + 99] - w2[uVar9 - 1]) / 0.001;
        pdVar6 = pdVar6 + (int)uVar8;
      }
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      pdVar11 = pdVar11 + 1;
    }
  }
  if (0 < q) {
    uVar5 = (ulong)(uint)q;
    memcpy(w3 + 99,raw + p,uVar5 * 8);
    artrans(q,w3 + 99,&local_9d8);
    iVar10 = p;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(q,w3 + 99,w2 + 99);
      iVar4 = iVar10;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        A[iVar4] = (w2[uVar9 + 99] - w2[uVar9 - 1]) / 0.001;
        iVar4 = iVar4 + uVar8;
      }
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      iVar10 = iVar10 + 1;
    }
  }
  if (0 < P) {
    uVar5 = (ulong)(uint)P;
    memcpy(w3 + 99,raw + iVar2,uVar5 * 8);
    artrans(P,w3 + 99,&local_9d8);
    iVar2 = uVar8 * iVar2 + iVar2;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(P,w3 + 99,w2 + 99);
      iVar10 = iVar2;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        A[iVar10] = (w2[uVar9 + 99] - w2[uVar9 - 1]) / 0.001;
        iVar10 = iVar10 + uVar8;
      }
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      iVar2 = iVar2 + 1;
    }
  }
  if (0 < Q) {
    uVar5 = (ulong)(uint)Q;
    memcpy(w3 + 99,raw + iVar3,uVar5 * 8);
    artrans(Q,w3 + 99,&local_9d8);
    iVar2 = uVar8 * iVar3 + P + q + p;
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      dVar1 = w3[uVar7 + 99];
      w3[uVar7 + 99] = dVar1 + 0.001;
      artrans(Q,w3 + 99,w2 + 99);
      iVar3 = iVar2;
      for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
        A[iVar3] = (w2[uVar9 + 99] - w2[uVar9 - 1]) / 0.001;
        iVar3 = iVar3 + uVar8;
      }
      w3[uVar7 + 99] = dVar1 + 0.001 + -0.001;
      iVar2 = iVar2 + 1;
    }
  }
  return;
}

Assistant:

void gradtrans(double *raw, int p, int q, int P, int Q,int M, double *A) {
	int i, j, v, N;
	double w1[100], w2[100], w3[100];
	double eps = 1e-03;
	N = p + q + P + Q + M;

	for (i = 0; i < N; ++i) {
		for (j = 0; j < N; ++j) {
			if (i == j) {
				A[i + j*N] = (double)i;
			}
		}
	}

	if (p > 0) {
		memcpy(w1, raw, sizeof(double)*p);
		artrans(p, w1, w2);

		for (i = 0; i < p; ++i) {
			w1[i] += eps;
			artrans(p, w1, w3);
			for (j = 0; j < p; ++j) {
				A[i + j*N] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (q > 0) {
		v = p;
		memcpy(w1, raw+v, sizeof(double)*q);
		artrans(q, w1, w2);

		for (i = 0; i < q; ++i) {
			w1[i] += eps;
			artrans(q, w1, w3);
			for (j = 0; j < q; ++j) {
				A[i + j*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (P > 0) {
		v = p + q;
		memcpy(w1, raw + v, sizeof(double)*P);
		artrans(P, w1, w2);

		for (i = 0; i < P; ++i) {
			w1[i] += eps;
			artrans(P, w1, w3);
			for (j = 0; j < P; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}

	if (Q > 0) {
		v = p + q + P;
		memcpy(w1, raw + v, sizeof(double)*Q);
		artrans(Q, w1, w2);

		for (i = 0; i < Q; ++i) {
			w1[i] += eps;
			artrans(Q, w1, w3);
			for (j = 0; j < Q; ++j) {
				A[i + (j + v)*N + v] = (w3[j] - w2[j]) / eps;
			}
			w1[i] -= eps;
		}
	}
}